

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_arg.cc
# Opt level: O3

void __thiscall
BuiltinFuncArg::BuiltinFuncArg
          (BuiltinFuncArg *this,char *arg_name,char *arg_type_str,char *arg_attr_str)

{
  int iVar1;
  char *__s1;
  int i;
  long lVar2;
  anon_struct_72_9_405e0b6f *paVar3;
  
  this->name = arg_name;
  this->type = 0xf;
  this->type_str = arg_type_str;
  this->attr_str = arg_attr_str;
  __s1 = "addr";
  paVar3 = builtin_func_arg_type;
  lVar2 = 0;
  do {
    paVar3 = paVar3 + 1;
    iVar1 = strcmp(__s1,arg_type_str);
    if (iVar1 == 0) {
      this->type = (int)lVar2;
      this->type_str = "";
    }
    lVar2 = lVar2 + 1;
    __s1 = paVar3->bif_type;
  } while (lVar2 != 0xf);
  return;
}

Assistant:

BuiltinFuncArg::BuiltinFuncArg(const char* arg_name, const char* arg_type_str,
                               const char* arg_attr_str)
	{
	name = arg_name;
	type = TYPE_OTHER;
	type_str = arg_type_str;
	attr_str = arg_attr_str;

	for ( int i = 0; builtin_func_arg_type[i].bif_type[0] != '\0'; ++i )
		if ( ! strcmp(builtin_func_arg_type[i].bif_type, arg_type_str) )
			{
			type = i;
			type_str = "";
			}
	}